

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O3

void __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::ResetStream
          (BacktrackingTokenStream<SGParser::Generator::StdGrammarToken> *this,
          TokenStream<SGParser::Generator::StdGrammarToken> *psourceStream,size_t rememberLength)

{
  StreamBlock *pSVar1;
  long *plVar2;
  StreamBlock *__old_val;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::StreamBlock_*>,_std::_Select1st<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::StreamBlock_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::StreamBlock_*>_>_>
  ::clear(&(this->Markers)._M_t);
  while( true ) {
    pSVar1 = this->pFirstBlock;
    if (pSVar1->pNext == (StreamBlock *)0x0) break;
    this->pFirstBlock = pSVar1->pNext;
    paVar3 = &pSVar1->Tokens[0x1ff].Str.field_2;
    lVar4 = -0x7000;
    do {
      plVar2 = (long *)(((String *)(paVar3 + -1))->_M_dataplus)._M_p;
      if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
        operator_delete(plVar2,paVar3->_M_allocated_capacity + 1);
      }
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)paVar3 + -0x38);
      lVar4 = lVar4 + 0x38;
    } while (lVar4 != 0);
    operator_delete(pSVar1,0x7018);
  }
  this->pThisBlock = pSVar1;
  pSVar1->Index = 0;
  this->ThisPos = 0;
  this->pSourceStream = psourceStream;
  this->RememberLength = rememberLength;
  this->LengthLeft =
       -(ulong)(psourceStream != (TokenStream<SGParser::Generator::StdGrammarToken> *)0x0);
  this->Pos = 0;
  this->SourceEOFFlag = false;
  return;
}

Assistant:

void BacktrackingTokenStream<Token>::ResetStream(TokenStream<Token>* psourceStream,
                                                 size_t rememberLength) noexcept {
    // Release all markers
    Markers.clear();
    // Release all but one buffer
    while (pFirstBlock->pNext)
        delete std::exchange(pFirstBlock, pFirstBlock->pNext);

    pThisBlock        = pFirstBlock;
    pThisBlock->Index = 0u;
    ThisPos           = 0u;
    // Reset variables
    pSourceStream     = psourceStream;
    RememberLength    = rememberLength;
    LengthLeft        = psourceStream ? MaxSize : 0u;
    Pos               = 0u;
    SourceEOFFlag     = false;
}